

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::BeginDataSegment
          (BinaryReaderInterp *this,Index index,Index memory_index,uint8_t flags)

{
  pointer pMVar1;
  Result RVar2;
  Enum EVar3;
  SegmentKind kind;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_1d8;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  Location loc;
  FuncDesc local_178;
  Location loc_1;
  Var local_78;
  
  kind = Declared;
  if ((~(uint)flags & 3) != 0) {
    kind = flags & Passive;
  }
  loc.field_1.field_0.last_column = 0;
  loc.filename._M_len = (this->filename_)._M_len;
  loc.filename._M_str = (this->filename_)._M_str;
  loc.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc_1.field_1.field_0.last_column = 0;
  loc_1.filename._M_len = (this->filename_)._M_len;
  loc_1.filename._M_str = (this->filename_)._M_str;
  loc_1.field_1.field_1.offset = loc.field_1.field_1.offset;
  Var::Var(&local_78,memory_index,&loc_1);
  RVar2 = SharedValidator::OnDataSegment(&this->validator_,&loc,&local_78,kind);
  Var::~Var(&local_78);
  if (RVar2.enum_ == Error) {
    EVar3 = Error;
  }
  else {
    pMVar1 = (this->memory_types_).
             super__Vector_base<wabt::interp::MemoryType,_std::allocator<wabt::interp::MemoryType>_>
             ._M_impl.super__Vector_impl_data._M_start;
    loc.filename._M_len = 0xffffffff;
    if (((ulong)memory_index <
         (ulong)(((long)(this->memory_types_).
                        super__Vector_base<wabt::interp::MemoryType,_std::allocator<wabt::interp::MemoryType>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar1) / 0x30)) &&
       (pMVar1[memory_index].limits.is_64 != false)) {
      loc.filename._M_len = 0xfffffffe;
    }
    local_1d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1b8 = 0;
    uStack_1b0 = 0;
    local_1a8 = 0;
    std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_range_initialize<wabt::Type_const*>
              ((vector<wabt::Type,std::allocator<wabt::Type>> *)&local_1b8,&loc);
    FuncType::FuncType((FuncType *)&loc_1,(ValueTypes *)&local_1d8,(ValueTypes *)&local_1b8);
    std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base
              ((_Vector_base<wabt::Type,_std::allocator<wabt::Type>_> *)&local_1b8);
    std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_1d8);
    loc.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
    loc.filename._M_len = 0;
    loc.filename._M_str = (char *)0x0;
    loc.field_1.field_0.last_column = kind;
    loc.field_1._12_4_ = memory_index;
    FuncDesc::FuncDesc(&local_178,(FuncDesc *)&loc_1);
    std::vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>::push_back
              (&this->module_->datas,(value_type *)&loc);
    DataDesc::~DataDesc((value_type *)&loc);
    FuncDesc::~FuncDesc((FuncDesc *)&loc_1);
    EVar3 = Ok;
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReaderInterp::BeginDataSegment(Index index,
                                            Index memory_index,
                                            uint8_t flags) {
  auto mode = ToSegmentMode(flags);
  CHECK_RESULT(validator_.OnDataSegment(
      GetLocation(), Var(memory_index, GetLocation()), mode));

  ValueType offset_type = ValueType::I32;
  if (memory_index < memory_types_.size() &&
      memory_types_[memory_index].limits.is_64) {
    offset_type = ValueType::I64;
  }
  FuncDesc init_func{
      FuncType{{}, {offset_type}}, {}, Istream::kInvalidOffset, {}};
  DataDesc desc{{}, mode, memory_index, init_func};
  module_.datas.push_back(desc);
  return Result::Ok;
}